

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O2

int lsend(lua_State *L)

{
  int __errnum;
  lua_Integer lVar1;
  char *__buf;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  size_t sz;
  
  sz = 0;
  lVar1 = luaL_checkinteger(L,1);
  __buf = luaL_checklstring(L,2,&sz);
  uVar6 = (uint)sz;
  do {
    do {
      if ((int)uVar6 < 1) {
        return 0;
      }
      sVar2 = send((int)lVar1,__buf,(ulong)uVar6,0);
      iVar5 = (int)sVar2;
      if (-1 < iVar5) goto LAB_0011e5ac;
      piVar3 = __errno_location();
      __errnum = *piVar3;
    } while ((__errnum == 4) || (__errnum == 0xb));
    pcVar4 = strerror(__errnum);
    luaL_error(L,"socket error: %s",pcVar4);
LAB_0011e5ac:
    __buf = __buf + iVar5;
    uVar6 = uVar6 - iVar5;
  } while( true );
}

Assistant:

static int
lsend(lua_State *L) {
	struct skynet_context * ctx = lua_touserdata(L, lua_upvalueindex(1));
	int id = luaL_checkinteger(L, 1);
	int sz = 0;
	void *buffer = get_buffer(L, 2, &sz);
	int err = skynet_socket_send(ctx, id, buffer, sz);
	lua_pushboolean(L, !err);
	return 1;
}